

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O1

DiagnosticSeverity __thiscall
slang::DiagnosticEngine::getSeverity(DiagnosticEngine *this,DiagCode code,SourceLocation location)

{
  group_type_pointer pgVar1;
  char cVar2;
  undefined4 uVar3;
  group_type_pointer pgVar4;
  ulong uVar5;
  uint uVar6;
  DiagnosticSeverity DVar7;
  _Optional_payload_base<slang::DiagnosticSeverity> _Var8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  value_type_pointer ppVar12;
  value_type *elements;
  uint uVar13;
  ulong uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  undefined1 auVar19 [16];
  
  _Var8 = (_Optional_payload_base<slang::DiagnosticSeverity>)findMappedSeverity(this,code,location);
  if (((ulong)_Var8 >> 0x20 & 1) != 0) goto LAB_001b2bc6;
  auVar19 = ZEXT416((int)code << 0x10 | (uint)code >> 0x10) * ZEXT816(0x9e3779b97f4a7c15);
  uVar11 = auVar19._8_8_ ^ auVar19._0_8_;
  uVar9 = uVar11 >> ((byte)(this->severityTable).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
                           .arrays.groups_size_index & 0x3f);
  pgVar4 = (this->severityTable).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
           .arrays.groups_;
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar11 & 0xff];
  ppVar12 = (this->severityTable).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
            .arrays.elements_;
  uVar5 = (this->severityTable).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<slang::DiagCode,_slang::DiagnosticSeverity>,_slang::hash<slang::DiagCode>,_std::equal_to<slang::DiagCode>,_std::allocator<std::pair<const_slang::DiagCode,_slang::DiagnosticSeverity>_>_>
          .arrays.groups_size_mask;
  uVar14 = 0;
  do {
    pgVar1 = pgVar4 + uVar9;
    uVar15 = (uchar)uVar3;
    auVar19[0] = -(pgVar1->m[0].n == uVar15);
    uVar16 = (uchar)((uint)uVar3 >> 8);
    auVar19[1] = -(pgVar1->m[1].n == uVar16);
    uVar17 = (uchar)((uint)uVar3 >> 0x10);
    auVar19[2] = -(pgVar1->m[2].n == uVar17);
    uVar18 = (uchar)((uint)uVar3 >> 0x18);
    auVar19[3] = -(pgVar1->m[3].n == uVar18);
    auVar19[4] = -(pgVar1->m[4].n == uVar15);
    auVar19[5] = -(pgVar1->m[5].n == uVar16);
    auVar19[6] = -(pgVar1->m[6].n == uVar17);
    auVar19[7] = -(pgVar1->m[7].n == uVar18);
    auVar19[8] = -(pgVar1->m[8].n == uVar15);
    auVar19[9] = -(pgVar1->m[9].n == uVar16);
    auVar19[10] = -(pgVar1->m[10].n == uVar17);
    auVar19[0xb] = -(pgVar1->m[0xb].n == uVar18);
    auVar19[0xc] = -(pgVar1->m[0xc].n == uVar15);
    auVar19[0xd] = -(pgVar1->m[0xd].n == uVar16);
    auVar19[0xe] = -(pgVar1->m[0xe].n == uVar17);
    auVar19[0xf] = -(pgVar1->m[0xf].n == uVar18);
    for (uVar13 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe); uVar13 != 0;
        uVar13 = uVar13 - 1 & uVar13) {
      uVar6 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
        }
      }
      if (ppVar12[uVar9 * 0xf + (ulong)uVar6].first == code) {
        ppVar12 = ppVar12 + uVar9 * 0xf + (ulong)uVar6;
        goto LAB_001b2b61;
      }
    }
    if ((pgVar4[uVar9].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar11 & 7]) == 0) break;
    lVar10 = uVar9 + uVar14;
    uVar14 = uVar14 + 1;
    uVar9 = lVar10 + 1U & uVar5;
  } while (uVar14 <= uVar5);
  ppVar12 = (value_type_pointer)0x0;
LAB_001b2b61:
  if (ppVar12 != (value_type_pointer)0x0) {
    _Var8._4_4_ = 0;
    _Var8._M_payload._M_value = ppVar12->second;
    goto LAB_001b2bc6;
  }
  DVar7 = getDefaultSeverity(code);
  switch(DVar7) {
  case Note:
    if (this->ignoreAllNotes != false) {
LAB_001b2bb5:
      _Var8._M_payload = (_Storage<slang::DiagnosticSeverity,_true>)0x0;
      _Var8._M_engaged = false;
      _Var8._5_3_ = 0;
      goto LAB_001b2bc6;
    }
    goto switchD_001b2b8b_default;
  case Warning:
    if (this->ignoreAllWarnings != false) goto LAB_001b2bb5;
    _Var8._M_payload = (_Storage<slang::DiagnosticSeverity,_true>)0x3;
    _Var8._M_engaged = false;
    _Var8._5_3_ = 0;
    cVar2 = this->warningsAsErrors;
    break;
  case Error:
    _Var8._M_payload = (_Storage<slang::DiagnosticSeverity,_true>)0x4;
    _Var8._M_engaged = false;
    _Var8._5_3_ = 0;
    cVar2 = this->errorsAsFatal;
    break;
  case Fatal:
    _Var8._M_payload = (_Storage<slang::DiagnosticSeverity,_true>)0x3;
    _Var8._M_engaged = false;
    _Var8._5_3_ = 0;
    cVar2 = this->fatalsAsErrors;
    break;
  default:
    goto switchD_001b2b8b_default;
  }
  if (cVar2 == '\0') {
switchD_001b2b8b_default:
    _Var8._4_4_ = 0;
    _Var8._M_payload._M_value = DVar7;
  }
LAB_001b2bc6:
  return (DiagnosticSeverity)_Var8._M_payload;
}

Assistant:

DiagnosticSeverity DiagnosticEngine::getSeverity(DiagCode code, SourceLocation location) const {
    // Check if we have an in-source severity configured.
    if (auto sev = findMappedSeverity(code, location); sev.has_value())
        return *sev;

    if (auto it = severityTable.find(code); it != severityTable.end())
        return it->second;

    auto result = getDefaultSeverity(code);
    switch (result) {
        case DiagnosticSeverity::Ignored:
            break;
        case DiagnosticSeverity::Note:
            if (ignoreAllNotes)
                return DiagnosticSeverity::Ignored;
            break;
        case DiagnosticSeverity::Warning:
            if (ignoreAllWarnings)
                return DiagnosticSeverity::Ignored;
            if (warningsAsErrors)
                return DiagnosticSeverity::Error;
            break;
        case DiagnosticSeverity::Error:
            if (errorsAsFatal)
                return DiagnosticSeverity::Fatal;
            break;
        case DiagnosticSeverity::Fatal:
            if (fatalsAsErrors)
                return DiagnosticSeverity::Error;
            break;
    }
    return result;
}